

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O1

void __thiscall
duckdb::RadixPartitionedColumnData::RadixPartitionedColumnData
          (RadixPartitionedColumnData *this,ClientContext *context_p,
          vector<duckdb::LogicalType,_true> *types_p,idx_t radix_bits_p,idx_t hash_col_idx_p)

{
  shared_ptr<duckdb::PartitionColumnDataAllocators,_true> *this_00;
  pointer pLVar1;
  PartitionColumnDataAllocators *pPVar2;
  reference this_01;
  ColumnDataAllocator *pCVar3;
  idx_t i;
  pointer this_02;
  idx_t index;
  size_type __n;
  vector<duckdb::LogicalType,_true> local_58;
  optional_idx local_38;
  
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PartitionedColumnData::PartitionedColumnData
            (&this->super_PartitionedColumnData,RADIX,context_p,&local_58);
  pLVar1 = local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_02 = local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_02 != pLVar1; this_02 = this_02 + 1)
  {
    LogicalType::~LogicalType(this_02);
  }
  if (local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_PartitionedColumnData)._vptr_PartitionedColumnData =
       (_func_int **)&PTR__RadixPartitionedColumnData_02491da8;
  this->radix_bits = radix_bits_p;
  this->hash_col_idx = hash_col_idx_p;
  __n = 1L << ((byte)radix_bits_p & 0x3f);
  this_00 = &(this->super_PartitionedColumnData).allocators;
  pPVar2 = shared_ptr<duckdb::PartitionColumnDataAllocators,_true>::operator->(this_00);
  std::
  vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>_>_>
  ::reserve((vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>_>_>
             *)&pPVar2->allocators,__n);
  index = 0;
  do {
    PartitionedColumnData::CreateAllocator(&this->super_PartitionedColumnData);
    pPVar2 = shared_ptr<duckdb::PartitionColumnDataAllocators,_true>::operator->(this_00);
    this_01 = vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>,_true>::back
                        (&pPVar2->allocators);
    pCVar3 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(this_01);
    optional_idx::optional_idx(&local_38,index);
    (pCVar3->partition_index).index = local_38.index;
    index = index + 1;
  } while (__n != index);
  return;
}

Assistant:

RadixPartitionedColumnData::RadixPartitionedColumnData(ClientContext &context_p, vector<LogicalType> types_p,
                                                       idx_t radix_bits_p, idx_t hash_col_idx_p)
    : PartitionedColumnData(PartitionedColumnDataType::RADIX, context_p, std::move(types_p)), radix_bits(radix_bits_p),
      hash_col_idx(hash_col_idx_p) {
	D_ASSERT(radix_bits <= RadixPartitioning::MAX_RADIX_BITS);
	D_ASSERT(hash_col_idx < types.size());
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	allocators->allocators.reserve(num_partitions);
	for (idx_t i = 0; i < num_partitions; i++) {
		CreateAllocator();
		allocators->allocators.back()->SetPartitionIndex(i);
	}
	D_ASSERT(allocators->allocators.size() == num_partitions);
}